

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Expr * __thiscall Parser::multiplicative_expression(Parser *this)

{
  Expr *pEVar1;
  ulong uVar2;
  Expr *pEVar3;
  Expr *local_30;
  
  pEVar1 = primary_expression(this);
  if (pEVar1 == (Expr *)0x0) {
    pEVar1 = (Expr *)0x0;
  }
  else {
    while (((this->tok->kind == Punctuator && (uVar2 = (ulong)(uint)this->tok->i, uVar2 < 0x30)) &&
           ((0x842000000000U >> (uVar2 & 0x3f) & 1) != 0))) {
      std::make_unique<BinExpr>();
      (local_30->super_Node).field_0xc = (char)this->tok->i;
      local_30[1].super_Node._vptr_Node = (_func_int **)pEVar1;
      next_token(this);
      pEVar3 = primary_expression(this);
      *(Expr **)&local_30[1].super_Node.kind = pEVar3;
      pEVar1 = local_30;
      if (pEVar3 == (Expr *)0x0) {
        error<char_const(&)[30],char&>
                  (this,(char (*) [30])"expecting expression after %c",
                   &(local_30->super_Node).field_0xc);
      }
    }
  }
  return pEVar1;
}

Assistant:

Expr* Parser::multiplicative_expression()
{
  std::unique_ptr<Expr> e(primary_expression());
  if (!e)
    return nullptr;

  while (is_punctuator('*') ||
         is_punctuator('/') ||
         is_punctuator('%')) {
    auto be = std::make_unique<BinExpr>();
    be->op = tok->i;
    be->lhs = e.release();

    next_token();
    be->rhs = primary_expression();
    if (!be->rhs)
      error("expecting expression after %c", be->op);

    e = std::move(be);
  }

  return e.release();
}